

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  EnumValueDescriptorProto *pEVar5;
  iterator __lhs;
  long lVar6;
  EnumDescriptor *in_RSI;
  DescriptorBuilder *in_RDI;
  string error;
  EnumValueDescriptor *enum_value;
  int i_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  int i;
  mapped_type *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  string *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  string *in_stack_fffffffffffffeb0;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [8];
  string *in_stack_ffffffffffffff40;
  ErrorLocation in_stack_ffffffffffffff4c;
  Message *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  DescriptorBuilder *in_stack_ffffffffffffff60;
  _Self local_88;
  int local_7c;
  _Self local_78;
  EnumValueDescriptor *local_70;
  int local_54;
  int local_1c;
  EnumDescriptor *local_10;
  
  local_10 = in_RSI;
  for (local_1c = 0; iVar2 = local_1c, iVar4 = EnumDescriptor::value_count(local_10), iVar2 < iVar4;
      local_1c = local_1c + 1) {
    lVar1 = *(long *)(local_10 + 0x30);
    lVar6 = (long)local_1c;
    pEVar5 = EnumDescriptorProto::value
                       ((EnumDescriptorProto *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    ValidateEnumValueOptions(in_RDI,(EnumValueDescriptor *)(lVar1 + lVar6 * 0x28),pEVar5);
  }
  EnumDescriptor::options(local_10);
  bVar3 = EnumOptions::has_allow_alias((EnumOptions *)0x4c811d);
  if (bVar3) {
    EnumDescriptor::options(local_10);
    bVar3 = EnumOptions::allow_alias((EnumOptions *)0x4c8138);
    if (bVar3) {
      return;
    }
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4c814d);
  for (local_54 = 0; iVar2 = local_54, iVar4 = EnumDescriptor::value_count(local_10), iVar2 < iVar4;
      local_54 = local_54 + 1) {
    local_70 = EnumDescriptor::value(local_10,local_54);
    local_7c = EnumValueDescriptor::number(local_70);
    __lhs = std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffe68,(key_type_conflict *)0x4c81e1);
    local_78._M_node = __lhs._M_node;
    local_88._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe68);
    bVar3 = std::operator!=(&local_78,&local_88);
    if (bVar3) {
      in_stack_fffffffffffffeb0 = EnumValueDescriptor::full_name_abi_cxx11_(local_70);
      std::operator+((char *)__lhs._M_node,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,
                     (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      in_stack_fffffffffffffeac = EnumValueDescriptor::number(local_70);
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffeb0,
                   (key_type_conflict *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::operator+(in_stack_fffffffffffffe78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      std::operator+(in_stack_fffffffffffffe78,
                     (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      EnumDescriptor::options(local_10);
      bVar3 = EnumOptions::allow_alias((EnumOptions *)0x4c832e);
      if (!bVar3) {
        EnumDescriptor::full_name_abi_cxx11_(local_10);
        EnumDescriptorProto::value
                  ((EnumDescriptorProto *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
        AddError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    }
    else {
      in_stack_fffffffffffffe78 = EnumValueDescriptor::full_name_abi_cxx11_(local_70);
      in_stack_fffffffffffffe74 = EnumValueDescriptor::number(local_70);
      in_stack_fffffffffffffe68 =
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffeb0,
                        (key_type_conflict *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::__cxx11::string::operator=
                ((string *)in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe78);
    }
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4c84da);
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        std::string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] +
            "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, error);
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}